

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O0

TokenList * slang::syntax::deepClone(TokenList *node,BumpAllocator *alloc)

{
  bool bVar1;
  size_type sVar2;
  TokenList *pTVar3;
  EVP_PKEY_CTX *src;
  BumpAllocator *this;
  span<slang::parsing::Token,_18446744073709551615UL> *in_RSI;
  undefined8 in_RDI;
  Token *ele;
  iterator __end2;
  iterator __begin2;
  TokenList *__range2;
  SmallVector<slang::parsing::Token,_2UL> buffer;
  Token *in_stack_ffffffffffffff28;
  SmallVectorBase<slang::parsing::Token> *in_stack_ffffffffffffff30;
  span<slang::parsing::Token,_18446744073709551615UL> *in_stack_ffffffffffffff38;
  __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
  local_60;
  undefined8 local_58;
  SmallVector<slang::parsing::Token,_2UL> local_48;
  span<slang::parsing::Token,_18446744073709551615UL> *local_10;
  undefined8 local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  sVar2 = std::span<slang::parsing::Token,_18446744073709551615UL>::size
                    ((span<slang::parsing::Token,_18446744073709551615UL> *)0xa4c318);
  SmallVector<slang::parsing::Token,_2UL>::SmallVector(&local_48,sVar2);
  local_58 = local_8;
  local_60._M_current =
       (Token *)std::span<slang::parsing::Token,_18446744073709551615UL>::begin
                          (in_stack_ffffffffffffff28);
  std::span<slang::parsing::Token,_18446744073709551615UL>::end(in_stack_ffffffffffffff38);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff30,
                       (__normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff28);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
    ::operator*(&local_60);
    parsing::Token::deepClone((Token *)__range2,(BumpAllocator *)__begin2._M_current);
    SmallVectorBase<slang::parsing::Token>::push_back
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    __gnu_cxx::
    __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
    ::operator++(&local_60);
  }
  SmallVectorBase<slang::parsing::Token>::copy
            (&local_48.super_SmallVectorBase<slang::parsing::Token>,(EVP_PKEY_CTX *)local_10,src);
  pTVar3 = BumpAllocator::
           emplace<slang::syntax::TokenList,std::span<slang::parsing::Token,18446744073709551615ul>>
                     (this,local_10);
  SmallVector<slang::parsing::Token,_2UL>::~SmallVector
            ((SmallVector<slang::parsing::Token,_2UL> *)0xa4c45b);
  return pTVar3;
}

Assistant:

inline TokenList* deepClone(const TokenList& node, BumpAllocator& alloc) {
    SmallVector<parsing::Token> buffer(node.size(), UninitializedTag());
    for (const auto& ele : node) {
        buffer.push_back(ele.deepClone(alloc));
    }
    return alloc.emplace<TokenList>(buffer.copy(alloc));
}